

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

void __thiscall
crnlib::
hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
::~hash_map(hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
            *this)

{
  clear(this);
  vector<crnlib::hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>::raw_node>
  ::~vector(&this->m_values);
  return;
}

Assistant:

inline ~hash_map()
        {
            clear();
        }